

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void disconnectAllVtab(sqlite3 *db)

{
  Schema *pSVar1;
  Table *p_00;
  HashElem *pHVar2;
  Module *pMod;
  Table *pTab;
  Schema *pSchema;
  HashElem *p;
  int i;
  sqlite3 *db_local;
  
  sqlite3BtreeEnterAll(db);
  for (p._4_4_ = 0; p._4_4_ < db->nDb; p._4_4_ = p._4_4_ + 1) {
    pSVar1 = db->aDb[p._4_4_].pSchema;
    if (pSVar1 != (Schema *)0x0) {
      for (pSchema = (Schema *)(pSVar1->tblHash).first; pSchema != (Schema *)0x0;
          pSchema = *(Schema **)pSchema) {
        p_00 = (Table *)(pSchema->tblHash).first;
        if (p_00->nModuleArg != 0) {
          sqlite3VtabDisconnect(db,p_00);
        }
      }
    }
  }
  for (pSchema = (Schema *)(db->aModule).first; pSchema != (Schema *)0x0;
      pSchema = *(Schema **)pSchema) {
    pHVar2 = (pSchema->tblHash).first;
    if (pHVar2[1].next != (HashElem *)0x0) {
      sqlite3VtabDisconnect(db,(Table *)pHVar2[1].next);
    }
  }
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  return;
}

Assistant:

static void disconnectAllVtab(sqlite3 *db){
#ifndef SQLITE_OMIT_VIRTUALTABLE
  int i;
  HashElem *p;
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Schema *pSchema = db->aDb[i].pSchema;
    if( pSchema ){
      for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
        Table *pTab = (Table *)sqliteHashData(p);
        if( IsVirtual(pTab) ) sqlite3VtabDisconnect(db, pTab);
      }
    }
  }
  for(p=sqliteHashFirst(&db->aModule); p; p=sqliteHashNext(p)){
    Module *pMod = (Module *)sqliteHashData(p);
    if( pMod->pEpoTab ){
      sqlite3VtabDisconnect(db, pMod->pEpoTab);
    }
  }
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
#else
  UNUSED_PARAMETER(db);
#endif
}